

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O1

void continuous_dist_test_icdf<trng::gamma_dist<long_double>>(gamma_dist<long_double> *d)

{
  long lVar1;
  undefined1 x [16];
  pointer plVar2;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  longdouble lVar6;
  ulong uVar7;
  int i;
  int iVar8;
  AssertionHandler *this;
  AssertionHandler *pAVar9;
  gamma_dist<long_double> *__return_storage_ptr__;
  longdouble in_ST0;
  longdouble lVar10;
  longdouble lVar11;
  longdouble lVar12;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar13;
  longdouble lVar14;
  longdouble lVar15;
  vector<long_double,_std::allocator<long_double>_> p_values;
  AssertionHandler catchAssertionHandler;
  undefined6 in_stack_fffffffffffffeb2;
  vector<long_double,_std::allocator<long_double>_> local_128;
  int local_104;
  SourceLineInfo local_100;
  longdouble local_f0;
  longdouble local_e4;
  longdouble local_d8;
  undefined1 local_c8 [16];
  longdouble *local_b8;
  char *local_b0;
  char *pcStack_a8;
  longdouble *local_a0;
  StringRef local_98;
  longdouble local_88;
  AssertionHandler local_78;
  
  local_e4 = (longdouble)2.7755576e-17;
  local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (longdouble *)0x0;
  local_78.m_assertionInfo.macroName._0_10_ = (BADTYPE)0.5;
  local_d8 = local_e4;
  std::vector<long_double,_std::allocator<long_double>_>::_M_realloc_insert<long_double>
            (&local_128,(iterator)0x0,(longdouble *)&local_78);
  iVar8 = 2;
  do {
    lVar10 = in_ST3;
    in_ST3 = in_ST4;
    lVar13 = in_ST4;
    local_104 = iVar8;
    powl();
    local_78.m_assertionInfo.macroName._0_10_ = (longdouble)0 + in_ST0;
    if (local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<long_double,_std::allocator<long_double>_>::_M_realloc_insert<long_double>
                (&local_128,
                 (iterator)
                 local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                 super__Vector_impl_data._M_finish,(longdouble *)&local_78);
      in_ST0 = in_ST2;
      in_ST2 = in_ST4;
      in_ST4 = lVar13;
    }
    else {
      *local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
       super__Vector_impl_data._M_finish = (longdouble)local_78.m_assertionInfo.macroName._0_10_;
      local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      in_ST0 = in_ST2;
      in_ST2 = in_ST4;
      in_ST4 = lVar13;
    }
    lVar13 = in_ST4;
    powl();
    local_78.m_assertionInfo.macroName._0_10_ = (longdouble)1 - in_ST1;
    if (local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      this = (AssertionHandler *)
             local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
             super__Vector_impl_data._M_finish;
      std::vector<long_double,_std::allocator<long_double>_>::_M_realloc_insert<long_double>
                (&local_128,
                 (iterator)
                 local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                 super__Vector_impl_data._M_finish,(longdouble *)&local_78);
    }
    else {
      *local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
       super__Vector_impl_data._M_finish = (longdouble)local_78.m_assertionInfo.macroName._0_10_;
      this = (AssertionHandler *)
             (local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
              super__Vector_impl_data._M_finish + 1);
      local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)this;
    }
    pAVar9 = (AssertionHandler *)
             local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    plVar2 = local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar8 = iVar8 + 1;
    in_ST1 = lVar10;
  } while (iVar8 != 0x40);
  if (local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar7 = (long)local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 4;
    lVar1 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<long_double*,std::vector<long_double,std::allocator<long_double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<long_double*,std::vector<long_double,std::allocator<long_double>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (plVar2);
    this = pAVar9;
  }
  plVar2 = local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pAVar9 = (AssertionHandler *)
             local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      lVar12 = *(longdouble *)&(pAVar9->m_assertionInfo).macroName;
      x._10_6_ = in_stack_fffffffffffffeb2;
      x._0_10_ = lVar12;
      __return_storage_ptr__ = d;
      lVar15 = lVar13;
      trng::gamma_dist<long_double>::icdf
                ((result_type_conflict3 *)d,(gamma_dist<long_double> *)this,(result_type_conflict3)x
                );
      lVar11 = (longdouble)0;
      lVar3 = lVar10;
      lVar4 = in_ST2;
      lVar5 = in_ST3;
      lVar6 = in_ST4;
      lVar14 = lVar13;
      if ((longdouble)0 < in_ST0) {
        lVar15 = lVar13;
        trng::math::detail::GammaP<long_double,true>
                  ((longdouble *)__return_storage_ptr__,(detail *)this,*(longdouble *)&(d->P).kappa_
                   ,in_ST0 / *(longdouble *)&(d->P).theta_);
        lVar11 = lVar10;
        lVar3 = in_ST2;
        lVar4 = in_ST3;
        lVar5 = in_ST4;
        lVar6 = lVar13;
      }
      lVar13 = lVar15;
      in_ST4 = lVar14;
      in_ST3 = lVar6;
      in_ST2 = lVar5;
      lVar10 = lVar4;
      in_ST0 = lVar3;
      lVar12 = ABS(lVar11 - lVar12);
      if (local_e4 <= lVar12) {
        local_c8._0_8_ = "REQUIRE";
        local_c8._8_8_ = 7;
        local_100.file =
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
        ;
        local_100.line = 0xa8;
        Catch::StringRef::StringRef(&local_98,"std::abs(y - p) < eps");
        Catch::AssertionHandler::AssertionHandler
                  (&local_78,(StringRef *)local_c8,&local_100,local_98,Normal);
        local_f0 = local_d8;
        local_88 = lVar12;
        Catch::StringRef::StringRef((StringRef *)&local_100,"<");
        local_c8[9] = lVar12 < local_f0;
        local_c8[8] = 1;
        local_c8._0_8_ = &PTR_streamReconstructedExpression_0031a338;
        local_b8 = &local_88;
        local_b0 = local_100.file;
        pcStack_a8 = (char *)local_100.line;
        local_a0 = &local_d8;
        this = (AssertionHandler *)local_c8;
        Catch::AssertionHandler::handleExpr(&local_78,(ITransientExpression *)local_c8);
        Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c8);
        Catch::AssertionHandler::complete(&local_78);
        if (local_78.m_completed == false) {
          this = &local_78;
          (*(local_78.m_resultCapture)->_vptr_IResultCapture[0xe])();
        }
      }
      pAVar9 = (AssertionHandler *)&(pAVar9->m_assertionInfo).lineInfo;
    } while (pAVar9 != (AssertionHandler *)plVar2);
  }
  if ((AssertionHandler *)
      local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
      super__Vector_impl_data._M_start != (AssertionHandler *)0x0) {
    operator_delete(local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void continuous_dist_test_icdf(const dist &d) {
  using result_type = typename dist::result_type;
  const auto eps{256 * std::numeric_limits<result_type>::epsilon()};
  std::vector<result_type> p_values;
  p_values.push_back(result_type{1} / result_type{2});
  for (int i{2}; i < std::numeric_limits<result_type>::digits; ++i) {
    p_values.push_back(result_type{0} + std::pow(p_values[0], result_type(i)));
    p_values.push_back(result_type{1} - std::pow(p_values[0], result_type(i)));
  }
  std::sort(p_values.begin(), p_values.end());
  for (const auto p : p_values) {
    const result_type x{d.icdf(p)};
    const result_type y{d.cdf(x)};
    if (not(std::abs(y - p) <
            eps))  // switch into REQUIRE macro in failure case only, for performance reasons
      REQUIRE(std::abs(y - p) < eps);
  }
}